

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_cryptor.c
# Opt level: O2

int aes_ctr_update(archive_crypto_ctx *ctx,uint8_t *in,size_t in_len,uint8_t *out,size_t *out_len)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar3 = ctx->encr_pos;
  if (*out_len < in_len) {
    in_len = *out_len;
  }
  for (uVar5 = 0; uVar6 = (uint)in_len, uVar5 < uVar6; uVar5 = uVar5 + 1) {
    if (uVar3 == 0x10) {
      aes_ctr_increase_counter(ctx);
      iVar1 = aes_ctr_encrypt_counter(ctx);
      while( true ) {
        if (iVar1 != 0) {
          return -1;
        }
        if (uVar6 - uVar5 < 0x10) break;
        for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
          uVar3 = uVar5 + (int)lVar2;
          out[uVar3] = ctx->encr_buf[lVar2] ^ in[uVar3];
        }
        uVar5 = uVar5 + 0x10;
        aes_ctr_increase_counter(ctx);
        iVar1 = aes_ctr_encrypt_counter(ctx);
      }
      uVar3 = 0;
      if (uVar6 <= uVar5) break;
    }
    uVar4 = (ulong)uVar3;
    uVar3 = uVar3 + 1;
    out[uVar5] = ctx->encr_buf[uVar4] ^ in[uVar5];
  }
  ctx->encr_pos = uVar3;
  *out_len = (ulong)uVar5;
  return 0;
}

Assistant:

static int
aes_ctr_update(archive_crypto_ctx *ctx, const uint8_t * const in,
    size_t in_len, uint8_t * const out, size_t *out_len)
{
	uint8_t *const ebuf = ctx->encr_buf;
	unsigned pos = ctx->encr_pos;
	unsigned max = (unsigned)((in_len < *out_len)? in_len: *out_len);
	unsigned i;

	for (i = 0; i < max; ) {
		if (pos == AES_BLOCK_SIZE) {
			aes_ctr_increase_counter(ctx);
			if (aes_ctr_encrypt_counter(ctx) != 0)
				return -1;
			while (max -i >= AES_BLOCK_SIZE) {
				for (pos = 0; pos < AES_BLOCK_SIZE; pos++)
					out[i+pos] = in[i+pos] ^ ebuf[pos];
				i += AES_BLOCK_SIZE;
				aes_ctr_increase_counter(ctx);
				if (aes_ctr_encrypt_counter(ctx) != 0)
					return -1;
			}
			pos = 0;
			if (i >= max)
				break;
		}
		out[i] = in[i] ^ ebuf[pos++];
		i++;
	}
	ctx->encr_pos = pos;
	*out_len = i;

	return 0;
}